

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O2

CloningFilter * anon_unknown.dwarf_a089a::getCloningFilter(HelicsFilter filt,HelicsError *err)

{
  FilterObject *pFVar1;
  CloningFilter *pCVar2;
  
  pFVar1 = getFilterObj(filt,err);
  if (pFVar1 != (FilterObject *)0x0) {
    if (pFVar1->cloning == false) {
      if (err != (HelicsError *)0x0) {
        err->error_code = -3;
        err->message = "filter must be a cloning filter";
      }
    }
    else if (pFVar1->filtPtr != (Filter *)0x0) {
      pCVar2 = (CloningFilter *)
               __dynamic_cast(pFVar1->filtPtr,&helics::Filter::typeinfo,
                              &helics::CloningFilter::typeinfo,0);
      return pCVar2;
    }
  }
  return (CloningFilter *)0x0;
}

Assistant:

helics::CloningFilter* getCloningFilter(HelicsFilter filt, HelicsError* err)
{
    auto* fObj = getFilterObj(filt, err);
    if (fObj == nullptr) {
        return nullptr;
    }
    if (!fObj->cloning) {
        static constexpr char nonCloningFilterString[] = "filter must be a cloning filter";
        assignError(err, HELICS_ERROR_INVALID_OBJECT, nonCloningFilterString);
        return nullptr;
    }
    return dynamic_cast<helics::CloningFilter*>(fObj->filtPtr);
}